

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGLabel * gen_jz_ecx_string(DisasContext *s,target_ulong next_eip)

{
  TCGContext *s_00;
  TCGLabel *label1;
  TCGLabel *l;
  
  s_00 = s->uc->tcg_ctx;
  label1 = gen_new_label_x86_64(s_00);
  l = gen_new_label_x86_64(s_00);
  gen_op_jnz_ecx(s,s->aflag,label1);
  gen_set_label(s_00,l);
  gen_jmp_tb(s,next_eip,1);
  gen_set_label(s_00,label1);
  return l;
}

Assistant:

static TCGLabel *gen_jz_ecx_string(DisasContext *s, target_ulong next_eip)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    gen_op_jnz_ecx(s, s->aflag, l1);
    gen_set_label(tcg_ctx, l2);
    gen_jmp_tb(s, next_eip, 1);
    gen_set_label(tcg_ctx, l1);
    return l2;
}